

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

uint64_t __thiscall slang::SourceManager::getSortKey(SourceManager *this,BufferID buffer)

{
  uint32_t uVar1;
  FileInfo *pFVar2;
  shared_lock<std::shared_mutex> *in_RDI;
  FileInfo *info;
  shared_lock<std::shared_mutex> lock;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  shared_lock<std::shared_mutex> *psVar3;
  SourceManager *in_stack_ffffffffffffffb0;
  BufferID in_stack_ffffffffffffffbc;
  shared_lock<std::shared_mutex> local_28;
  BufferID local_c;
  uint64_t local_8;
  
  psVar3 = &local_28;
  std::shared_lock<std::shared_mutex>::shared_lock
            (in_RDI,(mutex_type *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  pFVar2 = getFileInfo<std::shared_lock<std::shared_mutex>_>
                     (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffbc,psVar3);
  if (pFVar2 == (FileInfo *)0x0) {
    uVar1 = BufferID::getId(&local_c);
    local_8 = (ulong)uVar1 << 0x20;
  }
  else {
    local_8 = pFVar2->sortKey;
  }
  std::shared_lock<std::shared_mutex>::~shared_lock(in_RDI);
  return local_8;
}

Assistant:

uint64_t SourceManager::getSortKey(BufferID buffer) const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    auto info = getFileInfo(buffer, lock);
    if (!info)
        return uint64_t(buffer.getId()) << 32;

    return info->sortKey;
}